

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O2

void __thiscall SWDOperation::AddFrames(SWDOperation *this,SWDAnalyzerResults *pResults)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  SWDBit *this_00;
  pointer pSVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  pointer pSVar7;
  S64 local_a8;
  S64 SStack_a0;
  undefined1 local_98 [16];
  undefined2 local_88;
  SWDBit local_78;
  SWDRequestFrame req;
  
  Frame::Frame((Frame *)&local_a8);
  if (0xb < (ulong)(((long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x28)) {
    Frame::Frame(&req.super_Frame);
    this_00 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_start;
    req._0_8_ = SWDBit::GetStartSample(this_00);
    req._8_8_ = SWDBit::GetEndSample(this_00 + 7);
    req._33_1_ = this->APnDP * '\x02' | this->RnW;
    req._16_8_ = ZEXT18(this->request_byte);
    req._24_8_ = ZEXT48(this->reg);
    req._32_1_ = 3;
    AnalyzerResults::AddFrame((Frame *)pResults);
    SWDBit::MakeFrame(&local_78);
    local_88 = (undefined2)local_78.low_end;
    local_98._8_8_ = local_78.falling;
    local_a8._0_4_ = local_78.state_rising;
    local_a8._4_4_ = local_78.state_falling;
    SStack_a0 = local_78.low_start;
    Frame::~Frame((Frame *)&local_78);
    local_88._0_1_ = 4;
    AnalyzerResults::AddFrame((Frame *)pResults);
    pSVar4 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = SWDBit::GetStartSample(pSVar4 + 9);
    SStack_a0 = SWDBit::GetEndSample(pSVar4 + 0xb);
    local_88 = CONCAT11(local_88._1_1_,5);
    local_98._1_7_ = 0;
    local_98[0] = this->ACK;
    AnalyzerResults::AddFrame((Frame *)pResults);
    pSVar4 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0x2c < (ulong)(((long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0x28)) {
      pSVar7 = pSVar4 + 0xc;
      if (this->RnW == false) {
        SWDBit::MakeFrame(&local_78);
        local_88 = (undefined2)local_78.low_end;
        local_98._8_8_ = local_78.falling;
        local_98._0_8_ = local_78.rising;
        local_a8._0_4_ = local_78.state_rising;
        local_a8._4_4_ = local_78.state_falling;
        SStack_a0 = local_78.low_start;
        Frame::~Frame((Frame *)&local_78);
        local_88 = CONCAT11(local_88._1_1_,4);
        AnalyzerResults::AddFrame((Frame *)pResults);
        pSVar7 = pSVar4 + 0xd;
      }
      SWDBit::MakeFrame(&local_78);
      local_88 = (undefined2)local_78.low_end;
      local_a8._0_4_ = local_78.state_rising;
      local_a8._4_4_ = local_78.state_falling;
      SStack_a0 = local_78.low_start;
      Frame::~Frame((Frame *)&local_78);
      SStack_a0 = SWDBit::GetEndSample(pSVar7 + 0x1f);
      local_88 = CONCAT11(local_88._1_1_,6);
      local_98._4_4_ = 0;
      local_98._0_4_ = this->data;
      local_98._8_4_ = this->reg;
      local_98._12_4_ = 0;
      AnalyzerResults::AddFrame((Frame *)pResults);
      SWDBit::MakeFrame(&local_78);
      local_88 = (undefined2)local_78.low_end;
      local_a8._0_4_ = local_78.state_rising;
      local_a8._4_4_ = local_78.state_falling;
      SStack_a0 = local_78.low_start;
      Frame::~Frame((Frame *)&local_78);
      local_88 = CONCAT11(local_88._1_1_,7);
      uVar1 = this->data_parity;
      uVar2 = this->data_parity_ok;
      uVar3 = *(undefined2 *)&this->field_0xe;
      auVar5[0xc] = (char)((ushort)uVar3 >> 8);
      auVar5._0_12_ = ZEXT712(0);
      auVar6[1] = 0;
      auVar6[0] = (byte)uVar3;
      auVar6._2_3_ = auVar5._10_3_;
      auVar6._5_8_ = 0;
      local_98._1_7_ = 0;
      local_98[0] = uVar1;
      local_98._8_4_ = (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)(byte)uVar2);
      local_98._12_4_ = 0;
      AnalyzerResults::AddFrame((Frame *)pResults);
      pSVar4 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar7 + 0x21 < pSVar4) {
        local_a8 = SWDBit::GetStartSample(pSVar7 + 0x21);
        SStack_a0 = SWDBit::GetEndSample(pSVar4 + -1);
        local_88 = 8;
        local_98 = (undefined1  [16])0x0;
        AnalyzerResults::AddFrame((Frame *)pResults);
      }
    }
    Frame::~Frame(&req.super_Frame);
    Frame::~Frame((Frame *)&local_a8);
    return;
  }
  __assert_fail("bits.size() >= TRAN_REQ_AND_ACK",
                "/workspace/llm4binary/github/license_c_cmakelists/saleae[P]swd-analyzer/src/SWDTypes.cpp"
                ,0x47,"void SWDOperation::AddFrames(SWDAnalyzerResults *)");
}

Assistant:

void SWDOperation::AddFrames( SWDAnalyzerResults* pResults )
{
    Frame f;

    assert( bits.size() >= TRAN_REQ_AND_ACK );

    // request
    SWDRequestFrame req;
    req.mStartingSampleInclusive = bits[ 0 ].GetStartSample();
    req.mEndingSampleInclusive = bits[ 7 ].GetEndSample();
    req.mFlags = ( IsRead() ? SWDRequestFrame::IS_READ : 0 ) | ( APnDP ? SWDRequestFrame::IS_ACCESS_PORT : 0 );
    req.SetRequestByte( request_byte );
    req.SetRegister( reg );
    req.mType = SWDFT_Request;
    pResults->AddFrame( req );

    // turnaround
    f = bits[ 8 ].MakeFrame();
    f.mType = SWDFT_Turnaround;
    pResults->AddFrame( f );

    // ack
    f.mStartingSampleInclusive = bits[ 9 ].GetStartSample();
    f.mEndingSampleInclusive = bits[ 11 ].GetEndSample();
    f.mType = SWDFT_ACK;
    f.mData1 = ACK;
    pResults->AddFrame( f );

    if( bits.size() < TRAN_READ_LENGTH )
        return;

    // turnaround
    std::vector<SWDBit>::iterator bi( bits.begin() + 12 );
    if( !IsRead() )
    {
        f = bits[ 12 ].MakeFrame();
        f.mType = SWDFT_Turnaround;
        pResults->AddFrame( f );
        bi++;
    }

    // data
    f = bi->MakeFrame();
    f.mEndingSampleInclusive = bi[ 31 ].GetEndSample();
    f.mType = SWDFT_WData;
    f.mData1 = data;
    f.mData2 = reg;
    pResults->AddFrame( f );

    // data parity
    f = bi[ 32 ].MakeFrame();
    f.mType = SWDFT_DataParity;
    f.mData1 = data_parity;
    f.mData2 = data_parity_ok ? 1 : 0;
    pResults->AddFrame( f );

    bi += 33;

    // do we have trailing bits?
    if( bi < bits.end() )
    {
        f.mStartingSampleInclusive = bi->GetStartSample();
        f.mEndingSampleInclusive = bits.back().GetEndSample();
        f.mType = SWDFT_TrailingBits;

        f.mFlags = 0;
        f.mData1 = 0;
        f.mData2 = 0;

        pResults->AddFrame( f );
    }
}